

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O1

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,double v)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  HighsCDouble HVar6;
  HighsCDouble local_28;
  
  auVar2._8_8_ = v;
  auVar2._0_8_ = v;
  local_28 = (HighsCDouble)divpd((undefined1  [16])*this,auVar2);
  HVar6 = operator*(&local_28,v);
  dVar3 = HVar6.hi;
  dVar1 = this->hi;
  dVar5 = dVar3 - dVar1;
  dVar4 = local_28.hi - dVar5 / v;
  this->hi = dVar4;
  this->lo = ((-(dVar5 / v) - (dVar4 - local_28.hi)) +
              (local_28.hi - (dVar4 - (dVar4 - local_28.hi))) + local_28.lo) -
             (((-dVar1 - (dVar5 - dVar3)) + (dVar3 - (dVar5 - (dVar5 - dVar3))) + HVar6.lo) -
             this->lo) / v;
  return this;
}

Assistant:

HighsCDouble& operator/=(double v) {
    HighsCDouble d(hi / v, lo / v);
    HighsCDouble c = d * v - (*this);
    c.hi /= v;
    c.lo /= v;
    *this = d - c;
    return *this;
  }